

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_show_bb(dmr_C *C,basic_block *bb)

{
  uint uVar1;
  symbol *psVar2;
  int iVar3;
  char *pcVar4;
  undefined1 local_e8 [8];
  ptr_list_iter insniter__;
  ptr_list_iter toiter__;
  basic_block *to;
  ptr_list_iter fromiter__;
  basic_block *from;
  ptr_list_iter definesiter__;
  ptr_list_iter phiiter__;
  char *sep;
  pseudo_t phi;
  instruction *def;
  ptr_list_iter needsiter__;
  pseudo_t defines;
  pseudo_t needs;
  instruction *insn;
  basic_block *bb_local;
  dmr_C *C_local;
  
  printf(".L%u:\n",(ulong)bb->nr);
  if (C->verbose != 0) {
    pcVar4 = dmrC_stream_name(C,(uint)((ulong)bb->pos >> 6) & 0x3fff);
    printf("%s:%d\n",pcVar4,(ulong)(SUB84(bb->pos,4) & 0x7fffffff));
    ptrlist_forward_iterator((ptr_list_iter *)&def,(ptr_list *)bb->needs);
    defines = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)&def);
    while (defines != (pseudo_t)0x0) {
      psVar2 = (defines->field_5).sym;
      if (((undefined1  [232])*psVar2 & (undefined1  [232])0xff) == (undefined1  [232])0x2e) {
        phiiter__._16_8_ = (long)"%s <- %s    " + 0xb;
        pcVar4 = dmrC_show_pseudo(C,defines);
        printf("  **uses %s (from",pcVar4);
        ptrlist_forward_iterator((ptr_list_iter *)&definesiter__.__nr,(ptr_list *)psVar2->replace);
        sep = (char *)ptrlist_iter_next((ptr_list_iter *)&definesiter__.__nr);
        while (sep != (char *)0x0) {
          if ((pseudo *)sep != &C->L->void_pseudo) {
            pcVar4 = dmrC_show_pseudo(C,(pseudo_t)sep);
            printf("%s(%s:.L%u)",phiiter__._16_8_,pcVar4,
                   (ulong)*(uint *)(*(long *)(*(long *)(sep + 0x20) + 8) + 0x48));
            phiiter__._16_8_ = anon_var_dwarf_25573;
          }
          sep = (char *)ptrlist_iter_next((ptr_list_iter *)&definesiter__.__nr);
        }
        printf(")**\n");
      }
      else {
        pcVar4 = dmrC_show_pseudo(C,defines);
        printf("  **uses %s (from .L%u)**\n",pcVar4,
               (ulong)*(uint *)(*(long *)&(psVar2->pos).field_0x4 + 0x48));
      }
      defines = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)&def);
    }
    ptrlist_forward_iterator((ptr_list_iter *)&from,(ptr_list *)bb->defines);
    needsiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&from);
    while (needsiter__._16_8_ != 0) {
      pcVar4 = dmrC_show_pseudo(C,(pseudo_t)needsiter__._16_8_);
      printf("  **defines %s **\n",pcVar4);
      needsiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&from);
    }
    if (bb->parents != (basic_block_list *)0x0) {
      ptrlist_forward_iterator((ptr_list_iter *)&to,(ptr_list *)bb->parents);
      fromiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&to);
      while (fromiter__._16_8_ != 0) {
        uVar1 = *(uint *)(fromiter__._16_8_ + 0x48);
        pcVar4 = dmrC_stream_name(C,(uint)(*(ulong *)fromiter__._16_8_ >> 6) & 0x3fff);
        printf("  **from .L%u (%s:%d:%d)**\n",(ulong)uVar1,pcVar4,
               (ulong)((uint)((ulong)*(undefined8 *)fromiter__._16_8_ >> 0x20) & 0x7fffffff),
               (ulong)((uint)(*(ulong *)fromiter__._16_8_ >> 0x16) & 0x3ff));
        fromiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&to);
      }
    }
    if (bb->children != (basic_block_list *)0x0) {
      ptrlist_forward_iterator((ptr_list_iter *)&insniter__.__nr,(ptr_list *)bb->children);
      toiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&insniter__.__nr);
      while (toiter__._16_8_ != 0) {
        uVar1 = *(uint *)(toiter__._16_8_ + 0x48);
        pcVar4 = dmrC_stream_name(C,(uint)(*(ulong *)toiter__._16_8_ >> 6) & 0x3fff);
        printf("  **to .L%u (%s:%d:%d)**\n",(ulong)uVar1,pcVar4,
               (ulong)((uint)((ulong)*(undefined8 *)toiter__._16_8_ >> 0x20) & 0x7fffffff),
               (ulong)((uint)(*(ulong *)toiter__._16_8_ >> 0x16) & 0x3ff));
        toiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&insniter__.__nr);
      }
    }
  }
  ptrlist_forward_iterator((ptr_list_iter *)local_e8,(ptr_list *)bb->insns);
  needs = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_e8);
  while (needs != (pseudo_t)0x0) {
    if ((*(long *)&needs->size != 0) || (1 < C->verbose)) {
      pcVar4 = dmrC_show_instruction(C,(instruction *)needs);
      printf("\t%s\n",pcVar4);
    }
    needs = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_e8);
  }
  iVar3 = dmrC_bb_terminated(bb);
  if (iVar3 == 0) {
    printf("\tEND\n");
  }
  return;
}

Assistant:

void dmrC_show_bb(struct dmr_C *C, struct basic_block *bb)
{
	struct instruction *insn;

	printf(".L%u:\n", bb->nr);
	if (C->verbose) {
		pseudo_t needs, defines;
		printf("%s:%d\n", dmrC_stream_name(C, bb->pos.stream), bb->pos.line);

		FOR_EACH_PTR(bb->needs, needs) {
			struct instruction *def = needs->def;
			if (def->opcode != OP_PHI) {
				printf("  **uses %s (from .L%u)**\n", dmrC_show_pseudo(C, needs), def->bb->nr);
			} else {
				pseudo_t phi;
				const char *sep = " ";
				printf("  **uses %s (from", dmrC_show_pseudo(C, needs));
				FOR_EACH_PTR(def->phi_list, phi) {
					if (phi == VOID_PSEUDO(C))
						continue;
					printf("%s(%s:.L%u)", sep, dmrC_show_pseudo(C, phi), phi->def->bb->nr);
					sep = ", ";
				} END_FOR_EACH_PTR(phi);		
				printf(")**\n");
			}
		} END_FOR_EACH_PTR(needs);

		FOR_EACH_PTR(bb->defines, defines) {
			printf("  **defines %s **\n", dmrC_show_pseudo(C, defines));
		} END_FOR_EACH_PTR(defines);

		if (bb->parents) {
			struct basic_block *from;
			FOR_EACH_PTR(bb->parents, from) {
				printf("  **from .L%u (%s:%d:%d)**\n", from->nr,
					dmrC_stream_name(C, from->pos.stream), from->pos.line, from->pos.pos);
			} END_FOR_EACH_PTR(from);
		}

		if (bb->children) {
			struct basic_block *to;
			FOR_EACH_PTR(bb->children, to) {
				printf("  **to .L%u (%s:%d:%d)**\n", to->nr,
					dmrC_stream_name(C, to->pos.stream), to->pos.line, to->pos.pos);
			} END_FOR_EACH_PTR(to);
		}
	}

	FOR_EACH_PTR(bb->insns, insn) {
		if (!insn->bb && C->verbose < 2)
			continue;
		printf("\t%s\n", dmrC_show_instruction(C, insn));
	} END_FOR_EACH_PTR(insn);
	if (!dmrC_bb_terminated(bb))
		printf("\tEND\n");
}